

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

void __thiscall
pbrt::PiecewiseConstant2D::PiecewiseConstant2D
          (PiecewiseConstant2D *this,span<const_float> func,int nu,int nv,Bounds2f domain,
          Allocator alloc)

{
  float *pfVar1;
  float *pfVar2;
  size_t n;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  float *pfVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  span<const_float> f;
  Allocator alloc_local;
  Bounds2f domain_local;
  vector<float,_std::allocator<float>_> marginalFunc;
  size_t va;
  float *local_78;
  
  auVar10._8_56_ = domain._16_56_;
  auVar10._0_8_ = domain.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar9._8_56_ = domain._8_56_;
  auVar9._0_8_ = domain.pMin.super_Tuple2<pbrt::Point2,_float>;
  pfVar1 = (float *)func.n;
  pfVar2 = func.ptr;
  domain_local = (Bounds2f)vmovlhps_avx(auVar9._0_16_,auVar10._0_16_);
  pfVar6 = (float *)(long)nu;
  n = (size_t)nv;
  marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(n * (long)pfVar6);
  (this->domain).pMin.super_Tuple2<pbrt::Point2,_float> =
       domain_local.pMin.super_Tuple2<pbrt::Point2,_float>;
  (this->domain).pMax.super_Tuple2<pbrt::Point2,_float> =
       domain_local.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar8 = ZEXT816(0) << 0x20;
  (this->pConditionalV).alloc.memoryResource = alloc.memoryResource;
  (this->pConditionalV).nStored = 0;
  (this->pConditionalV).ptr = (PiecewiseConstant1D *)auVar8._0_8_;
  (this->pConditionalV).nAlloc = auVar8._8_8_;
  (this->pMarginal).func.alloc.memoryResource = alloc.memoryResource;
  (this->pMarginal).func.ptr = (float *)auVar8._0_8_;
  (this->pMarginal).func.nAlloc = auVar8._8_8_;
  (this->pMarginal).func.nStored = 0;
  (this->pMarginal).cdf.alloc.memoryResource = alloc.memoryResource;
  (this->pMarginal).cdf.ptr = (float *)auVar8._0_8_;
  (this->pMarginal).cdf.nAlloc = auVar8._8_8_;
  (this->pMarginal).cdf.nStored = 0;
  (this->pMarginal).funcInt = 0.0;
  alloc_local = alloc;
  va = (size_t)pfVar1;
  if ((long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start - (long)pfVar1 == 0) {
    pstd::
    vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
    ::reserve(&this->pConditionalV,n);
    uVar3 = (ulong)(uint)(~(nv >> 0x1f) & nv);
    uVar4 = uVar3;
    while (bVar7 = uVar4 != 0, uVar4 = uVar4 - 1, bVar7) {
      local_78 = pfVar1;
      if (pfVar6 <= pfVar1) {
        local_78 = pfVar6;
      }
      va = (size_t)pfVar2;
      pstd::
      vector<pbrt::PiecewiseConstant1D,pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>>
      ::
      emplace_back<pstd::span<float_const>,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                ((vector<pbrt::PiecewiseConstant1D,pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>>
                  *)&this->pConditionalV,(span<const_float> *)&va,(float *)&domain_local,
                 (float *)&domain_local.pMax,&alloc_local);
      pfVar2 = pfVar2 + (long)pfVar6;
      pfVar1 = (float *)((long)pfVar1 - (long)pfVar6);
    }
    marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::reserve(&marginalFunc,n);
    for (lVar5 = 0; uVar3 * 0x50 - lVar5 != 0; lVar5 = lVar5 + 0x50) {
      va = CONCAT44(va._4_4_,*(undefined4 *)((long)&((this->pConditionalV).ptr)->funcInt + lVar5));
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(&marginalFunc,(float *)&va);
    }
    f.n = (long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
    f.ptr = marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
    PiecewiseConstant1D::PiecewiseConstant1D
              ((PiecewiseConstant1D *)&va,f,domain_local.pMin.super_Tuple2<pbrt::Point2,_float>.y,
               domain_local.pMax.super_Tuple2<pbrt::Point2,_float>.y,alloc_local);
    PiecewiseConstant1D::operator=(&this->pMarginal,(PiecewiseConstant1D *)&va);
    PiecewiseConstant1D::~PiecewiseConstant1D((PiecewiseConstant1D *)&va);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&marginalFunc.super__Vector_base<float,_std::allocator<float>_>);
    return;
  }
  LogFatal<char_const(&)[12],char_const(&)[24],char_const(&)[12],unsigned_long&,char_const(&)[24],unsigned_long&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.h"
             ,0x30f,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [12])0x7b8498,
             (char (*) [24])"(size_t)nu * (size_t)nv",(char (*) [12])0x7b8498,&va,
             (char (*) [24])"(size_t)nu * (size_t)nv",(unsigned_long *)&marginalFunc);
}

Assistant:

PiecewiseConstant2D(pstd::span<const Float> func, int nu, int nv, Bounds2f domain,
                        Allocator alloc = {})
        : domain(domain), pConditionalV(alloc), pMarginal(alloc) {
        CHECK_EQ(func.size(), (size_t)nu * (size_t)nv);
        pConditionalV.reserve(nv);
        for (int v = 0; v < nv; ++v)
            // Compute conditional sampling distribution for $\tilde{v}$
            pConditionalV.emplace_back(func.subspan(v * nu, nu), domain.pMin[0],
                                       domain.pMax[0], alloc);

        // Compute marginal sampling distribution $p[\tilde{v}]$
        std::vector<Float> marginalFunc;
        marginalFunc.reserve(nv);
        for (int v = 0; v < nv; ++v)
            marginalFunc.push_back(pConditionalV[v].Integral());
        pMarginal =
            PiecewiseConstant1D(marginalFunc, domain.pMin[1], domain.pMax[1], alloc);
    }